

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,Variable *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  bool *__rhs;
  VarType type;
  string traversedName;
  VarType local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __rhs = SSBOArrayLengthTests::init::arraysSized + 1;
  if (numArrayElements < 0) {
    __rhs = (bool *)0x8015b8;
  }
  std::operator+(&local_48,&this->m_name,__rhs);
  if (numArrayElements < 0) {
    glu::VarType::VarType(&local_60,&this->m_type);
  }
  else {
    glu::VarType::VarType(&local_60,&this->m_type,numArrayElements);
  }
  glslTraverseBasicTypes(__return_storage_ptr__,&local_48,&local_60,0,indentationDepth,visit);
  glu::VarType::~VarType(&local_60);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::glslTraverseBasicTypeArray (int numArrayElements, int indentationDepth, BasicTypeVisitFunc visit) const
{
	DE_ASSERT(m_isArray);

	const bool				traverseAsArray		= numArrayElements >= 0;
	const string			traversedName		= m_name + (!traverseAsArray ? "[gl_InvocationID]" : "");
	const glu::VarType		type				= traverseAsArray ? glu::VarType(m_type, numArrayElements) : m_type;

	return UserDefinedIOCase::glslTraverseBasicTypes(traversedName, type, 0, indentationDepth, visit);
}